

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

void Js::ProfilingHelpers::ProfiledStFld_Strict_Jit
               (Var instance,PropertyId propertyId,InlineCacheIndex inlineCacheIndex,Var value,
               void *framePointer)

{
  JavascriptCallStackLayout *pJVar1;
  ScriptFunction *scriptFunction_00;
  InlineCache *inlineCache;
  ScriptFunction *scriptFunction;
  void *framePointer_local;
  Var value_local;
  InlineCacheIndex inlineCacheIndex_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  pJVar1 = JavascriptCallStackLayout::FromFramePointer(framePointer);
  scriptFunction_00 =
       UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar1);
  inlineCache = GetInlineCache(scriptFunction_00,inlineCacheIndex);
  ProfiledStFld<false>
            (instance,propertyId,inlineCache,inlineCacheIndex,value,PropertyOperation_StrictMode,
             scriptFunction_00,instance);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStFld_Strict_Jit(
        const Var instance,
        const PropertyId propertyId,
        const InlineCacheIndex inlineCacheIndex,
        const Var value,
        void *const framePointer)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledStFld_Strict);
        ScriptFunction *const scriptFunction =
            UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        ProfiledStFld<false>(
            instance,
            propertyId,
            GetInlineCache(scriptFunction, inlineCacheIndex),
            inlineCacheIndex,
            value,
            PropertyOperation_StrictMode,
            scriptFunction,
            instance);
        JIT_HELPER_END(ProfiledStFld_Strict);
    }